

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O3

ctmbstr getNextInstalledLanguage(TidyIterator *iter)

{
  ctmbstr ptVar1;
  TidyIterator p_Var2;
  TidyIterator p_Var3;
  TidyIterator p_Var4;
  
  if (iter == (TidyIterator *)0x0) {
    __assert_fail("iter != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/language.c"
                  ,0x37e,"ctmbstr getNextInstalledLanguage(TidyIterator *)");
  }
  p_Var2 = *iter;
  p_Var3 = (TidyIterator)(ulong)prvTidytidyInstalledLanguageListSize::array_size;
  if (p_Var2 == (TidyIterator)0x0) {
    ptVar1 = (ctmbstr)0x0;
    p_Var2 = (TidyIterator)0x0;
  }
  else {
    if (prvTidytidyInstalledLanguageListSize::array_size == 0) {
      if (PTR_language_en_001910a0 == (undefined *)0x0) {
        p_Var3 = (TidyIterator)0x0;
      }
      else {
        p_Var3 = (TidyIterator)0x0;
        do {
          prvTidytidyInstalledLanguageListSize::array_size = (int)p_Var3 + 1;
          p_Var3 = (TidyIterator)(ulong)prvTidytidyInstalledLanguageListSize::array_size;
        } while ((&PTR_language_en_001910a0)[(long)p_Var3] != (undefined *)0x0);
      }
    }
    if (p_Var3 < p_Var2) {
      ptVar1 = (ctmbstr)0x0;
    }
    else {
      ptVar1 = (&tidyLanguages.fallbackLanguage)[(long)p_Var2]->messages[0].value;
      p_Var2 = (TidyIterator)((long)&p_Var2->_opaque + 1);
    }
  }
  if ((int)p_Var3 == 0) {
    if (PTR_language_en_001910a0 == (undefined *)0x0) {
      p_Var3 = (TidyIterator)0x0;
    }
    else {
      p_Var3 = (TidyIterator)0x0;
      do {
        prvTidytidyInstalledLanguageListSize::array_size = (int)p_Var3 + 1;
        p_Var3 = (TidyIterator)(ulong)prvTidytidyInstalledLanguageListSize::array_size;
      } while ((&PTR_language_en_001910a0)[(long)p_Var3] != (undefined *)0x0);
    }
  }
  p_Var4 = (TidyIterator)0x0;
  if (p_Var2 <= p_Var3) {
    p_Var4 = p_Var2;
  }
  *iter = p_Var4;
  return ptVar1;
}

Assistant:

ctmbstr getNextInstalledLanguage( TidyIterator* iter )
{
    ctmbstr item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= TY_(tidyInstalledLanguageListSize)() )
    {
        item = tidyLanguages.languages[itemIndex - 1]->messages[0].value;
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= TY_(tidyInstalledLanguageListSize)() ? itemIndex : (size_t)0 );
    return item;
}